

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

string * __thiscall
QPDFJob::json_out_schema_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this,int version)

{
  JSON local_28;
  int local_14;
  string *psStack_10;
  int version_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  json_schema((QPDFJob *)&local_28,local_14,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0);
  JSON::unparse_abi_cxx11_(__return_storage_ptr__,&local_28);
  JSON::~JSON(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::json_out_schema(int version)
{
    return json_schema(version).unparse();
}